

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTContext.cpp
# Opt level: O0

bool __thiscall
slang::ast::ASTContext::requireIntegral(ASTContext *this,ConstantValue *cv,SourceRange range)

{
  SourceRange sourceRange;
  bool bVar1;
  undefined8 in_RCX;
  SourceLocation in_RDX;
  ASTContext *in_RSI;
  SourceLocation in_RDI;
  DiagCode code;
  undefined1 local_1;
  
  code = SUB84((ulong)in_RCX >> 0x20,0);
  bVar1 = slang::ConstantValue::bad((ConstantValue *)0x10fba6b);
  if (bVar1) {
    local_1 = false;
  }
  else {
    bVar1 = slang::ConstantValue::isInteger((ConstantValue *)0x10fba82);
    if (bVar1) {
      local_1 = true;
    }
    else {
      sourceRange.endLoc = in_RDX;
      sourceRange.startLoc = in_RDI;
      addDiag(in_RSI,code,sourceRange);
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool ASTContext::requireIntegral(const ConstantValue& cv, SourceRange range) const {
    if (cv.bad())
        return false;

    if (!cv.isInteger()) {
        addDiag(diag::ValueMustBeIntegral, range);
        return false;
    }
    return true;
}